

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

_Deque_iterator<long,_long_&,_long_*> * __thiscall
UnitTests::OutputElement<std::_Deque_iterator<long,long&,long*>>
          (_Deque_iterator<long,_long_&,_long_*> *__return_storage_ptr__,UnitTests *this,ostream *os
          ,_Deque_iterator<long,_long_&,_long_*> *iter,_Deque_iterator<long,_long_&,_long_*> *end)

{
  _Deque_iterator<long,_long_&,_long_*> *os_00;
  bool bVar1;
  reference t;
  _Self *__x;
  expected_got_outputter<long> local_30;
  _Deque_iterator<long,_long_&,_long_*> *local_28;
  _Deque_iterator<long,_long_&,_long_*> *end_local;
  _Deque_iterator<long,_long_&,_long_*> *iter_local;
  ostream *os_local;
  
  local_28 = iter;
  end_local = (_Deque_iterator<long,_long_&,_long_*> *)os;
  iter_local = (_Deque_iterator<long,_long_&,_long_*> *)this;
  os_local = (ostream *)__return_storage_ptr__;
  bVar1 = std::operator!=((_Self *)os,iter);
  os_00 = iter_local;
  if (bVar1) {
    t = std::_Deque_iterator<long,_long_&,_long_*>::operator*
                  ((_Deque_iterator<long,_long_&,_long_*> *)os);
    local_30 = stream<long>(t);
    details::operator<<((ostream *)os_00,&local_30);
    __x = std::_Deque_iterator<long,_long_&,_long_*>::operator++
                    ((_Deque_iterator<long,_long_&,_long_*> *)os);
    std::_Deque_iterator<long,_long_&,_long_*>::_Deque_iterator(__return_storage_ptr__,__x);
  }
  else {
    std::operator<<((ostream *)iter_local,"##EOF!##");
    std::_Deque_iterator<long,_long_&,_long_*>::_Deque_iterator
              (__return_storage_ptr__,(_Deque_iterator<long,_long_&,_long_*> *)os);
  }
  return __return_storage_ptr__;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }